

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O0

ConstructBlockSet * __thiscall
spvtools::val::Construct::blocks
          (ConstructBlockSet *__return_storage_ptr__,Construct *this,Function *param_1)

{
  bool bVar1;
  bool bVar2;
  ConstructType CVar3;
  ConstructType CVar4;
  BasicBlock *this_00;
  BasicBlock *this_01;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *this_02;
  reference ppCVar5;
  reference ppBVar6;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *this_03;
  reference ppBVar7;
  pair<std::_Rb_tree_const_iterator<spvtools::val::BasicBlock_*>,_bool> pVar8;
  BasicBlock *local_c0;
  BasicBlock *succ;
  iterator __end5;
  iterator __begin5;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range5;
  value_type pBStack_78;
  bool include;
  BasicBlock *block;
  BasicBlock *local_68;
  undefined1 local_60 [8];
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  BasicBlock *local_40;
  BasicBlock *continue_header;
  bool is_loop;
  bool is_continue;
  BasicBlock *exit;
  BasicBlock *header;
  Function *param_1_local;
  Construct *this_local;
  ConstructBlockSet *construct_blocks;
  
  this_00 = entry_block(this);
  this_01 = exit_block(this);
  CVar3 = type(this);
  CVar4 = type(this);
  local_40 = (BasicBlock *)0x0;
  if (CVar4 == kLoop) {
    this_02 = corresponding_constructs(this);
    stack.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
                  begin(this_02);
    ppCVar5 = __gnu_cxx::
              __normal_iterator<spvtools::val::Construct_*const_*,_std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>_>
              ::operator*((__normal_iterator<spvtools::val::Construct_*const_*,_std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>_>
                           *)&stack.
                              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_40 = entry_block(*ppCVar5);
  }
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_60);
  local_68 = this_00;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_60,&local_68);
  block._7_1_ = 0;
  std::
  set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
  ::set(__return_storage_ptr__);
  while (bVar1 = std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 empty((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppBVar6 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              ::back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      *)local_60);
    pBStack_78 = *ppBVar6;
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::pop_back
              ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
               local_60);
    bVar1 = BasicBlock::structurally_dominates(this_00,pBStack_78);
    if (bVar1) {
      bVar1 = false;
      if ((CVar3 == kContinue) &&
         (bVar2 = BasicBlock::structurally_postdominates(this_01,pBStack_78), bVar2)) {
        bVar1 = true;
      }
      else {
        bVar2 = BasicBlock::structurally_dominates(this_01,pBStack_78);
        if ((!bVar2) &&
           ((bVar1 = true, CVar4 == kLoop &&
            (bVar2 = BasicBlock::structurally_dominates(local_40,pBStack_78), bVar2)))) {
          bVar1 = false;
        }
      }
      if ((bVar1) &&
         (pVar8 = std::
                  set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ::insert(__return_storage_ptr__,&stack0xffffffffffffff88),
         ((pVar8.second ^ 0xffU) & 1) == 0)) {
        this_03 = BasicBlock::structural_successors(pBStack_78);
        __end5 = std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 begin(this_03);
        succ = (BasicBlock *)
               std::
               vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
               end(this_03);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                           *)&succ), bVar1) {
          ppBVar7 = __gnu_cxx::
                    __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                    ::operator*(&__end5);
          local_c0 = *ppBVar7;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     *)local_60,&local_c0);
          __gnu_cxx::
          __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
          ::operator++(&__end5);
        }
      }
    }
  }
  block._7_1_ = 1;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::~vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             local_60);
  return __return_storage_ptr__;
}

Assistant:

Construct::ConstructBlockSet Construct::blocks(Function* /*function*/) const {
  const auto header = entry_block();
  const auto exit = exit_block();
  const bool is_continue = type() == ConstructType::kContinue;
  const bool is_loop = type() == ConstructType::kLoop;
  const BasicBlock* continue_header = nullptr;
  if (is_loop) {
    // The only corresponding construct for a loop is the continue.
    continue_header = (*corresponding_constructs().begin())->entry_block();
  }
  std::vector<BasicBlock*> stack;
  stack.push_back(const_cast<BasicBlock*>(header));
  ConstructBlockSet construct_blocks;
  while (!stack.empty()) {
    auto* block = stack.back();
    stack.pop_back();

    if (header->structurally_dominates(*block)) {
      bool include = false;
      if (is_continue && exit->structurally_postdominates(*block)) {
        // Continue construct include blocks dominated by the continue target
        // and post-dominated by the back-edge block.
        include = true;
      } else if (!exit->structurally_dominates(*block)) {
        // Selection and loop constructs include blocks dominated by the header
        // and not dominated by the merge.
        include = true;
        if (is_loop && continue_header->structurally_dominates(*block)) {
          // Loop constructs have an additional constraint that they do not
          // include blocks dominated by the continue construct. Since all
          // blocks in the continue construct are dominated by the continue
          // target, we just test for dominance by continue target.
          include = false;
        }
      }
      if (include) {
        if (!construct_blocks.insert(block).second) continue;

        for (auto succ : *block->structural_successors()) {
          stack.push_back(succ);
        }
      }
    }
  }

  return construct_blocks;
}